

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_generator.hpp
# Opt level: O0

node_pointer __thiscall
ranger::bhvr_tree::abstract_generator<$86869e04$>::generate_node_by_name
          (abstract_generator<_86869e04_> *this,char *name,xml_node<char> *data)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  _Base_ptr in_RCX;
  code *local_c0;
  _Self local_70 [3];
  allocator local_51;
  key_type local_50;
  _Self local_30;
  const_iterator it;
  xml_node<char> *data_local;
  char *name_local;
  abstract_generator<_86869e04_> *this_local;
  
  it._M_node = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,(char *)data,&local_51);
  local_30._M_node =
       (_Base_ptr)std::map<$b62053ef$>::find((map<_b62053ef_> *)(name + 0x60),&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_70[0]._M_node = (_Base_ptr)std::map<$b62053ef$>::end((map<_b62053ef_> *)(name + 0x60));
  bVar1 = std::operator==(&local_30,local_70);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"bhvr_tree_error: cannot find node[");
    poVar2 = std::operator<<(poVar2,(char *)data);
    poVar2 = std::operator<<(poVar2,"]\'s generate handler");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::
    unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>,std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>>>
    ::
    unique_ptr<std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>>,void>
              ((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>,std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>>>
                *)this);
  }
  else {
    ppVar3 = std::_Rb_tree_const_iterator<$e7f3f39e$>::operator->(&local_30);
    local_c0 = (code *)ppVar3->second;
    if (((ulong)local_c0 & 1) != 0) {
      local_c0 = *(code **)(local_c0 + *(long *)(name + *(long *)&ppVar3->field_0x28) + -1);
    }
    (*local_c0)(this,name + *(long *)&ppVar3->field_0x28,it._M_node);
  }
  return (__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
          )(__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
            )this;
}

Assistant:

node_pointer generate_node_by_name(const char* name, Data data) const {
    auto it = m_generate_handlers.find(name);
    if (it == m_generate_handlers.end()) {
      std::cerr << "bhvr_tree_error: cannot find node[" << name << "]'s generate handler" << std::endl;
      return node_pointer();
    }

    return (this->*it->second)(data);
  }